

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O0

SnapshotImpl * __thiscall
leveldb::SnapshotList::New(SnapshotList *this,SequenceNumber sequence_number)

{
  bool bVar1;
  bool bVar2;
  SnapshotImpl *pSVar3;
  SnapshotImpl *snapshot;
  SequenceNumber sequence_number_local;
  SnapshotList *this_local;
  
  bVar2 = empty(this);
  bVar1 = true;
  if (!bVar2) {
    pSVar3 = newest(this);
    bVar1 = pSVar3->sequence_number_ <= sequence_number;
  }
  if (!bVar1) {
    __assert_fail("empty() || newest()->sequence_number_ <= sequence_number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/snapshot.h"
                  ,0x3a,"SnapshotImpl *leveldb::SnapshotList::New(SequenceNumber)");
  }
  pSVar3 = (SnapshotImpl *)operator_new(0x28);
  SnapshotImpl::SnapshotImpl(pSVar3,sequence_number);
  pSVar3->list_ = this;
  pSVar3->next_ = &this->head_;
  pSVar3->prev_ = (this->head_).prev_;
  pSVar3->prev_->next_ = pSVar3;
  pSVar3->next_->prev_ = pSVar3;
  return pSVar3;
}

Assistant:

SnapshotImpl* New(SequenceNumber sequence_number) {
    assert(empty() || newest()->sequence_number_ <= sequence_number);

    SnapshotImpl* snapshot = new SnapshotImpl(sequence_number);

#if !defined(NDEBUG)
    snapshot->list_ = this;
#endif  // !defined(NDEBUG)
    snapshot->next_ = &head_;
    snapshot->prev_ = head_.prev_;
    snapshot->prev_->next_ = snapshot;
    snapshot->next_->prev_ = snapshot;
    return snapshot;
  }